

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_data.h
# Opt level: O3

size_t __thiscall ON_SubDHeap::SizeOfUnusedMeshFragments(ON_SubDHeap *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t i;
  long lVar5;
  ON_FixedSizePoolElement **ppOVar6;
  
  sVar1 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_full_fragments);
  sVar2 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_part_fragments);
  sVar3 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_oddball_fragments);
  sVar4 = ON_FixedSizePool::SizeOfUnusedElements(&this->m_fsp_limit_curves);
  sVar1 = sVar4 + sVar3 + sVar2 + sVar1;
  lVar5 = 0;
  do {
    ppOVar6 = this->m_unused_fragments + lVar5;
    sVar1 = sVar1 - g_sizeof_fragment[lVar5];
    do {
      ppOVar6 = &(*ppOVar6)->m_next;
      sVar1 = sVar1 + g_sizeof_fragment[lVar5];
    } while (ppOVar6 != (ON_FixedSizePoolElement **)0x0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  return sVar1;
}

Assistant:

size_t SizeOfUnusedMeshFragments() const
  {
    size_t sz 
      = m_fsp_full_fragments.SizeOfUnusedElements()
      + m_fsp_part_fragments.SizeOfUnusedElements()
      + m_fsp_oddball_fragments.SizeOfUnusedElements()
      + m_fsp_limit_curves.SizeOfUnusedElements();

    // It has always been the case that count0 = count1 = ON_SubDDisplayParameters::MaximumDensity + 1.
    // But a wrong answer is better than crashing if somebody incorrectly modifies ON_SubDHeap 
    // in the far future.
    const size_t count0 = sizeof(m_unused_fragments) / sizeof(m_unused_fragments[0]);
    const size_t count1 = sizeof(ON_SubDHeap::g_sizeof_fragment) / sizeof(ON_SubDHeap::g_sizeof_fragment[0]);
    for (size_t i = 0; i < count0 && i < count1; ++i)
    {
      const size_t sizeof_fragment = ON_SubDHeap::g_sizeof_fragment[i];
      // The memory for these fragments is managed by m_fsp_full_fragments or m_fsp_part_fragments.
      for (const ON_FixedSizePoolElement* e = m_unused_fragments[i]; nullptr != e; e = e->m_next)
        sz += sizeof_fragment;
    }

    return sz;
  }